

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void greet_prog_inner_guardian(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  char buf [4608];
  CHAR_DATA *in_stack_000025c8;
  CHAR_DATA *in_stack_000025d0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  int in_stack_fffffffffffff014;
  CHAR_DATA *in_stack_fffffffffffff018;
  CHAR_DATA *in_stack_fffffffffffff020;
  
  bVar1 = is_npc(in_stack_ffffffffffffede8);
  if (((!bVar1) && (bVar1 = is_immortal(in_stack_ffffffffffffede8), !bVar1)) &&
     (*(short *)(in_RSI + 0x132) != *(short *)(in_RDI + 0x132))) {
    sprintf(&stack0xffffffffffffede8,"Intruder! Intruder! %s is raiding the cabal!",
            *(undefined8 *)(in_RSI + 0xf0));
    do_cb((CHAR_DATA *)buf._224_8_,(char *)buf._216_8_);
    if (*(short *)(in_RSI + 0x2dc) < 1) {
      multi_hit(in_stack_fffffffffffff020,in_stack_fffffffffffff018,in_stack_fffffffffffff014);
    }
    else {
      do_say((CHAR_DATA *)buf._376_8_,(char *)buf._368_8_);
      raw_kill(in_stack_000025d0,in_stack_000025c8);
    }
  }
  return;
}

Assistant:

void greet_prog_inner_guardian(CHAR_DATA *mob, CHAR_DATA *ch)
{
	char buf[MSL];

	if (is_npc(ch) || is_immortal(ch))
		return;

	if (ch->cabal == mob->cabal)
		return;

	sprintf(buf, "Intruder! Intruder! %s is raiding the cabal!", ch->true_name);
	do_cb(mob, buf);

	if (ch->ghost > 0)
	{
		do_say(mob, "Ghosts aren't allowed in here!");
		raw_kill(mob, ch);
		return;
	}

	multi_hit(mob, ch, TYPE_UNDEFINED);
}